

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O0

void __thiscall
memt::Arena::
freeTopArray<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,0ul>>
          (Arena *this,_frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL> *array,
          _frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL> *arrayEnd)

{
  _frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL> *local_20;
  _frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL> *arrayEnd_local;
  _frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL> *array_local;
  Arena *this_local;
  
  local_20 = arrayEnd;
  while (local_20 != array) {
    local_20 = local_20 + -1;
    anon_unknown.dwarf_71e7::_frobby_Helper<(anonymous_namespace)::_frobby_ConDeconHelperTag,_0UL>::
    ~_frobby_Helper(local_20);
  }
  freeTop(this,array);
  return;
}

Assistant:

void Arena::freeTopArray(T* array, T* arrayEnd) {
    MEMT_ASSERT(array != 0);
    MEMT_ASSERT(array <= arrayEnd);

    while (arrayEnd != array) {
      --arrayEnd;
      arrayEnd->~T();
    }
    freeTop(array);
  }